

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

uint ON_SubDEdgeChain::RefineEdgeChains
               (ON_SimpleArray<ON_SubDEdgePtr> *unconditional_edge_chains,bool bOrdinarySmoothChains
               ,bool bOrdinaryCreaseChains,ON_SimpleArray<ON_SubDEdgePtr> *refined_edge_chains)

{
  ON_SubDEdgeTag OVar1;
  unsigned_short uVar2;
  uint uVar3;
  ON_SubDEdgeSharpness OVar4;
  int iVar5;
  _func_int **pp_Var6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  char cVar14;
  uint uVar15;
  ON_SubDEdge *edge;
  ON_SubDEdge *pOVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  ON_SubDEdgePtr eptr;
  ON_SimpleArray<ON_SubDEdgePtr> local_unconditional_edge_chains;
  ON_SubDEdgePtr local_50;
  ON_SimpleArray<ON_SubDEdgePtr> local_48;
  
  uVar3 = unconditional_edge_chains->m_count;
  if ((uVar3 == 0) || (unconditional_edge_chains->m_a != refined_edge_chains->m_a)) {
    if (((ulong)(uint)refined_edge_chains->m_count != 0) &&
       (7 < refined_edge_chains->m_a[(ulong)(uint)refined_edge_chains->m_count - 1].m_ptr)) {
      ON_SimpleArray<ON_SubDEdgePtr>::Append(refined_edge_chains,&ON_SubDEdgePtr::Null);
    }
    if (uVar3 == 0) {
      uVar9 = 0;
    }
    else {
      uVar9 = 0;
      uVar15 = 0;
      uVar12 = 0;
      do {
        local_48._vptr_ON_SimpleArray = (_func_int **)unconditional_edge_chains->m_a[uVar12].m_ptr;
        pOVar16 = (ON_SubDEdge *)((ulong)local_48._vptr_ON_SimpleArray & 0xfffffffffffffff8);
        if (pOVar16 != (ON_SubDEdge *)0x0) {
          ON_SimpleArray<ON_SubDEdgePtr>::Append(refined_edge_chains,(ON_SubDEdgePtr *)&local_48);
          OVar1 = pOVar16->m_edge_tag;
          uVar2 = pOVar16->m_face_count;
          if ((OVar1 == SmoothX) || (OVar1 == Smooth)) {
            bVar7 = ON_SubDEdge::IsSharp(pOVar16);
          }
          else {
            bVar7 = false;
          }
          pp_Var6 = local_48._vptr_ON_SimpleArray;
          if (bVar7 == false) {
            fVar19 = 0.0;
          }
          else if ((ON_SubDEdge *)((ulong)local_48._vptr_ON_SimpleArray & 0xfffffffffffffff8) ==
                   (ON_SubDEdge *)0x0) {
            fVar19 = ON_SubDEdgeSharpness::Nan.m_edge_sharpness[1];
          }
          else {
            OVar4 = ON_SubDEdge::Sharpness
                              ((ON_SubDEdge *)
                               ((ulong)local_48._vptr_ON_SimpleArray & 0xfffffffffffffff8),false);
            fVar19 = OVar4.m_edge_sharpness[1];
            if (((ulong)pp_Var6 & 1) != 0) {
              fVar19 = OVar4.m_edge_sharpness[0];
            }
          }
          uVar13 = uVar12;
          do {
            iVar5 = (int)uVar13;
            uVar15 = iVar5 + 1;
            if (uVar3 <= uVar15) break;
            uVar13 = unconditional_edge_chains->m_a[uVar15].m_ptr;
            cVar14 = '\x05';
            pOVar16 = (ON_SubDEdge *)(uVar13 & 0xfffffffffffffff8);
            local_50.m_ptr = uVar13;
            if (((pOVar16 != (ON_SubDEdge *)0x0) && (uVar2 == pOVar16->m_face_count)) &&
               ((OVar1 == Smooth || OVar1 == SmoothX) ==
                (pOVar16->m_edge_tag == SmoothX || pOVar16->m_edge_tag == Smooth))) {
              fVar18 = fVar19;
              if (bVar7 == false) {
LAB_005f84a0:
                ON_SimpleArray<ON_SubDEdgePtr>::Append(refined_edge_chains,&local_50);
                if ((local_50.m_ptr & 0xfffffffffffffff8) == 0) {
                  lVar11 = 0;
                }
                else {
                  lVar11 = *(long *)((local_50.m_ptr & 0xfffffffffffffff8) + 0x80 +
                                    (ulong)(~(uint)local_50.m_ptr & 1) * 8);
                }
                fVar19 = fVar18;
                if (lVar11 == 0) {
                  uVar15 = iVar5 + 2;
                }
                else if ((OVar1 == SmoothX) || (OVar1 == Smooth)) {
                  if (bOrdinarySmoothChains) {
                    if (*(char *)(lVar11 + 0x60) == '\x01') {
                      cVar14 = '\0';
                      if (bVar7 == false) {
                        bVar8 = *(short *)(lVar11 + 0x68) == 4;
                        goto LAB_005f8566;
                      }
                    }
                    else {
                      uVar15 = iVar5 + 2;
                    }
                  }
                  else {
                    cVar14 = '\a';
                  }
                }
                else {
                  cVar14 = '\a';
                  if (bOrdinaryCreaseChains) {
                    bVar8 = *(char *)(lVar11 + 0x60) == '\x02';
LAB_005f8566:
                    uVar10 = iVar5 + 2;
                    if (bVar8) {
                      uVar10 = uVar15;
                    }
                    uVar15 = uVar10;
                    cVar14 = !bVar8 * '\x05';
                  }
                }
              }
              else {
                bVar8 = ON_SubDEdge::IsSharp(pOVar16);
                if (bVar8) {
                  OVar4 = ON_SubDEdge::Sharpness(pOVar16,false);
                  fVar17 = OVar4.m_edge_sharpness[0];
                  fVar18 = OVar4.m_edge_sharpness[1];
                  if ((uVar13 & 1) != 0) {
                    fVar17 = OVar4.m_edge_sharpness[1];
                    fVar18 = OVar4.m_edge_sharpness[0];
                  }
                  fVar18 = (float)(~-(uint)(fVar19 == fVar17) & (uint)fVar19 |
                                  (uint)fVar18 & -(uint)(fVar19 == fVar17));
                  if ((fVar19 == fVar17) && (!NAN(fVar19) && !NAN(fVar17))) goto LAB_005f84a0;
                  cVar14 = (-(fVar19 != fVar17) & 1U) * '\x05';
                  fVar19 = fVar18;
                }
              }
            }
            uVar13 = (ulong)uVar15;
          } while (cVar14 != '\x05');
          uVar9 = uVar9 + 1;
          ON_SimpleArray<ON_SubDEdgePtr>::Append(refined_edge_chains,&ON_SubDEdgePtr::Null);
        }
        uVar10 = (uint)uVar12 + 1;
        if ((uint)uVar12 < uVar15) {
          uVar10 = uVar15;
        }
        uVar12 = (ulong)uVar10;
      } while (uVar10 < uVar3);
    }
  }
  else {
    local_48._vptr_ON_SimpleArray = (_func_int **)&PTR__ON_SimpleArray_00825d08;
    local_48.m_a = (ON_SubDEdgePtr *)0x0;
    local_48.m_count = 0;
    local_48.m_capacity = 0;
    ON_SimpleArray<ON_SubDEdgePtr>::operator=(&local_48,unconditional_edge_chains);
    if (-1 < refined_edge_chains->m_capacity) {
      refined_edge_chains->m_count = 0;
    }
    uVar9 = RefineEdgeChains(&local_48,bOrdinarySmoothChains,bOrdinaryCreaseChains,
                             refined_edge_chains);
    ON_SimpleArray<ON_SubDEdgePtr>::~ON_SimpleArray(&local_48);
  }
  return uVar9;
}

Assistant:

unsigned ON_SubDEdgeChain::RefineEdgeChains(
  const ON_SimpleArray<ON_SubDEdgePtr>& unconditional_edge_chains,
  bool bOrdinarySmoothChains,
  bool bOrdinaryCreaseChains,
  ON_SimpleArray<ON_SubDEdgePtr>& refined_edge_chains
)
{
  const unsigned unconditional_edge_count = unconditional_edge_chains.UnsignedCount();

  if (unconditional_edge_count > 0 && unconditional_edge_chains.Array() == refined_edge_chains.Array())
  {
    // copy unconditional_edge_chains[] to a local array so we can modify refined_edge_chains[]
    const ON_SimpleArray<ON_SubDEdgePtr> local_unconditional_edge_chains(unconditional_edge_chains);
    refined_edge_chains.SetCount(0); // In this uniquecase we do not append because in[ut array = output array.
    return ON_SubDEdgeChain::RefineEdgeChains(
      local_unconditional_edge_chains,
      bOrdinarySmoothChains,
      bOrdinaryCreaseChains,
      refined_edge_chains
    );
  }

  if (refined_edge_chains.UnsignedCount() > 0 && refined_edge_chains.Last()->IsNotNull())
  {
    // Append a null separator to refined_edge_chains[].
    refined_edge_chains.Append(ON_SubDEdgePtr::Null);
  }

  unsigned int refined_chain_count = 0;
  unsigned i1 = 0U;
  for (unsigned i0 = 0; i0 < unconditional_edge_count; i0 = (i0 < i1) ? i1 : (i0 + 1U))
  {
    const ON_SubDEdgePtr eptr0 = unconditional_edge_chains[i0];
    const ON_SubDEdge* e0 = eptr0.Edge();
    if (nullptr == e0)
      continue;

    refined_edge_chains.Append(eptr0);

    const unsigned short edge_face_count = e0->m_face_count;
    const bool bSmoothChain = e0->IsSmooth();
    const bool bSharpChain = bSmoothChain ? e0->IsSharp() : false;
    ON_SubDEdgeSharpness prev_sharpness = bSharpChain ? eptr0.RelativeSharpness(false) : ON_SubDEdgeSharpness::Smooth;

    for (i1 = i0 + 1; i1 < unconditional_edge_count; ++i1)
    {
      const ON_SubDEdgePtr eptr = unconditional_edge_chains[i1];
      const ON_SubDEdge* e = eptr.Edge();
      if (nullptr == e)
        break;
      if (edge_face_count != e->m_face_count)
        break;
      if (bSmoothChain != e->IsSmooth())
        break;
      if (bSharpChain)
      {
        if (false == e->IsSharp())
          break;
        const ON_SubDEdgeSharpness s = eptr.RelativeSharpness(false);
        if (false == (prev_sharpness.EndSharpness(1) == s.EndSharpness(0)))
          break;
        prev_sharpness = s;
      }

      // Add eptr to current chain
      refined_edge_chains.Append(eptr);

      const ON_SubDVertex* v = eptr.RelativeVertex(1);
      if (nullptr == v)
      {
        ++i1;
        break;
      }

      if (bSmoothChain)
      {
        if (false == bOrdinarySmoothChains)
          continue;
        if (false == v->IsSmooth())
        {
          ++i1;
          break;
        }        
        if (false == bSharpChain && 4 != v->m_edge_count)
        {
          ++i1;
          break;
        }
      }
      else
      {
        if (false == bOrdinaryCreaseChains)
          continue;
        if (false == v->IsCrease())
        {
          ++i1;
          break;
        }
      }
    }

    // finished with this chain.
    ++refined_chain_count;
    refined_edge_chains.Append(ON_SubDEdgePtr::Null);
  }

  return refined_chain_count;
}